

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compoundfile_stream_and_dir.hpp
# Opt level: O2

void __thiscall CompoundFile::Stream::seekToNextSector(Stream *this)

{
  istream *piVar1;
  int32_t iVar2;
  reference pvVar3;
  size_type sVar4;
  SecID largeSector;
  SecID local_24;
  
  if (this->m_mode == LargeStream) {
    sVar4 = (long)this->m_largeSecIDIdx + 1;
    this->m_largeSecIDIdx = (int32_t)sVar4;
    piVar1 = this->m_stream;
    pvVar3 = std::vector<CompoundFile::SecID,_std::allocator<CompoundFile::SecID>_>::at
                       (&this->m_largeStreamChain,sVar4);
    std::istream::seekg((long)piVar1,pvVar3->m_id * this->m_sectorSize + 0x200);
    pvVar3 = std::vector<CompoundFile::SecID,_std::allocator<CompoundFile::SecID>_>::at
                       (&this->m_largeStreamChain,(long)this->m_largeSecIDIdx);
    (this->m_currentLargeSectorID).m_id = pvVar3->m_id;
    std::istream::read((char *)this->m_stream,
                       (long)(this->m_buf).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                             super__Vector_impl_data._M_start);
    this->m_pos = 0;
  }
  else {
    sVar4 = (long)this->m_shortSecIDIdx + 1;
    this->m_shortSecIDIdx = (int32_t)sVar4;
    local_24.m_id = -2;
    pvVar3 = std::vector<CompoundFile::SecID,_std::allocator<CompoundFile::SecID>_>::at
                       (&this->m_shortStreamChain,sVar4);
    iVar2 = whereIsShortSector(this,pvVar3,&local_24);
    if ((this->m_currentLargeSectorID).m_id != local_24.m_id) {
      (this->m_currentLargeSectorID).m_id = local_24.m_id;
      std::istream::seekg((long)this->m_stream,this->m_header->m_sectorSize * local_24.m_id + 0x200)
      ;
      std::istream::read((char *)this->m_stream,
                         (long)(this->m_buf).super__Vector_base<char,_std::allocator<char>_>._M_impl
                               .super__Vector_impl_data._M_start);
    }
    this->m_pos = iVar2 * this->m_header->m_shortSectorSize;
  }
  return;
}

Assistant:

inline void
Stream::seekToNextSector()
{
	if( m_mode == LargeStream )
	{
		++m_largeSecIDIdx;

		m_stream.seekg( calcFileOffset( m_largeStreamChain.at( m_largeSecIDIdx ),
			m_sectorSize ), std::ios::beg );

		m_currentLargeSectorID = m_largeStreamChain.at( m_largeSecIDIdx );

		m_stream.read( &m_buf[ 0 ], m_sectorSize );

		m_pos = 0;
	}
	else
	{
		++m_shortSecIDIdx;

		SecID largeSector;
		const int32_t offset =
			whereIsShortSector( m_shortStreamChain.at( m_shortSecIDIdx ),
				largeSector );

		if( m_currentLargeSectorID != largeSector )
		{
			m_currentLargeSectorID = largeSector;

			std::streampos pos = calcFileOffset( largeSector,
				m_header.sectorSize() );

			m_stream.seekg( pos, std::ios::beg );

			m_stream.read( &m_buf[ 0 ], m_header.sectorSize() );
		}

		m_pos = offset * m_header.shortSectorSize();
	}
}